

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

bool __thiscall cmCursesMainForm::LookForCacheEntry(cmCursesMainForm *this,string *key)

{
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar1;
  pointer ppcVar2;
  pointer __s1;
  size_t __n;
  int iVar3;
  pointer ppcVar4;
  bool bVar5;
  
  pvVar1 = this->Entries;
  if (pvVar1 == (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 *)0x0) {
    bVar5 = false;
  }
  else {
    ppcVar4 = (pvVar1->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppcVar2 = (pvVar1->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = ppcVar4 != ppcVar2;
    if (bVar5) {
      __s1 = (key->_M_dataplus)._M_p;
      __n = key->_M_string_length;
      do {
        if (__n == ((*ppcVar4)->Key)._M_string_length) {
          if (__n == 0) {
            return bVar5;
          }
          iVar3 = bcmp(__s1,((*ppcVar4)->Key)._M_dataplus._M_p,__n);
          if (iVar3 == 0) {
            return bVar5;
          }
        }
        ppcVar4 = ppcVar4 + 1;
        bVar5 = ppcVar4 != ppcVar2;
      } while (bVar5);
    }
  }
  return bVar5;
}

Assistant:

bool cmCursesMainForm::LookForCacheEntry(const std::string& key)
{
  if (!this->Entries)
    {
    return false;
    }

  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
    {
    if (key == (*it)->Key)
      {
      return true;
      }
    }

  return false;
}